

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O3

void __thiscall
ConfidentialTxIn_Constractor1_Test::~ConfidentialTxIn_Constractor1_Test
          (ConfidentialTxIn_Constractor1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTxIn, Constractor1) {
  ConfidentialTxIn txin1(exp_txid, exp_index, exp_sequence);
  EXPECT_EQ(txin1.GetVout(), exp_index);
  EXPECT_EQ(txin1.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin1.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());

  ConfidentialTxIn txin2(exp_txid, exp_index, exp_sequence, exp_script);
  EXPECT_EQ(txin2.GetVout(), exp_index);
  EXPECT_EQ(txin2.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin2.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txin2.GetUnlockingScript().GetHex().c_str(),
      exp_script.GetHex().c_str());
}